

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

vector<arc::atom,_std::allocator<arc::atom>_> *
arc::atom_to_vector(vector<arc::atom,_std::allocator<arc::atom>_> *__return_storage_ptr__,atom *a)

{
  bool bVar1;
  atom *paVar2;
  atom *a_local;
  vector<arc::atom,_std::allocator<arc::atom>_> *r;
  
  std::vector<arc::atom,_std::allocator<arc::atom>_>::vector(__return_storage_ptr__);
  while (bVar1 = no(a), ((bVar1 ^ 0xffU) & 1) != 0) {
    paVar2 = car(a);
    std::vector<arc::atom,_std::allocator<arc::atom>_>::push_back(__return_storage_ptr__,paVar2);
    paVar2 = cdr(a);
    atom::operator=(a,paVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<atom> atom_to_vector(atom a) {
		vector<atom> r;
		for (; !no(a); a = cdr(a)) {
			r.push_back(car(a));
		}
		return r;
	}